

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O3

char * portfwdmgr_connect(PortFwdManager *mgr,Channel **chan_ret,char *hostname,int port,
                         SshChannel *c,int addressfamily)

{
  SockAddr *addr;
  char *pcVar1;
  char *pcVar2;
  PortForwarding *pf;
  Socket *pSVar3;
  char *dummy_realhost;
  Channel **local_38;
  
  pcVar2 = (char *)0x0;
  dummy_realhost = (char *)0x0;
  addr = name_lookup(hostname,port,&dummy_realhost,mgr->conf,addressfamily,(LogContext *)0x0,
                     (char *)0x0);
  pcVar1 = sk_addr_error(addr);
  if (pcVar1 == (char *)0x0) {
    pf = (PortForwarding *)safemalloc(1,0x58,0);
    pf->hostname = (char *)0x0;
    pf->socksbuf = (strbuf *)0x0;
    *chan_ret = &pf->chan;
    (pf->plug).vt = &PortForwarding_plugvt;
    (pf->chan).initial_fixed_window_size = 0;
    (pf->chan).vt = &PortForwarding_channelvt;
    pf->input_wanted = true;
    pf->ready = true;
    pf->c = c;
    pf->cl = mgr->cl;
    pf->socks_state = SOCKS_NONE;
    local_38 = chan_ret;
    pSVar3 = new_connection(addr,dummy_realhost,port,false,true,false,false,&pf->plug,mgr->conf,
                            (Interactor *)0x0);
    pf->s = pSVar3;
    safefree(dummy_realhost);
    pcVar1 = (*pf->s->vt->socket_error)(pf->s);
    if (pcVar1 != (char *)0x0) {
      pcVar2 = dupstr(pcVar1);
      (*pf->s->vt->close)(pf->s);
      free_portfwd_state(pf);
      *local_38 = (Channel *)0x0;
    }
  }
  else {
    pcVar2 = dupstr(pcVar1);
    sk_addr_free(addr);
    safefree(dummy_realhost);
  }
  return pcVar2;
}

Assistant:

char *portfwdmgr_connect(PortFwdManager *mgr, Channel **chan_ret,
                         char *hostname, int port, SshChannel *c,
                         int addressfamily)
{
    SockAddr *addr;
    const char *err;
    char *dummy_realhost = NULL;
    struct PortForwarding *pf;

    /*
     * Try to find host.
     */
    addr = name_lookup(hostname, port, &dummy_realhost, mgr->conf,
                       addressfamily, NULL, NULL);
    if ((err = sk_addr_error(addr)) != NULL) {
        char *err_ret = dupstr(err);
        sk_addr_free(addr);
        sfree(dummy_realhost);
        return err_ret;
    }

    /*
     * Open socket.
     */
    pf = new_portfwd_state();
    *chan_ret = &pf->chan;
    pf->plug.vt = &PortForwarding_plugvt;
    pf->chan.initial_fixed_window_size = 0;
    pf->chan.vt = &PortForwarding_channelvt;
    pf->input_wanted = true;
    pf->ready = true;
    pf->c = c;
    pf->cl = mgr->cl;
    pf->socks_state = SOCKS_NONE;

    pf->s = new_connection(addr, dummy_realhost, port,
                           false, true, false, false, &pf->plug, mgr->conf,
                           NULL);
    sfree(dummy_realhost);
    if ((err = sk_socket_error(pf->s)) != NULL) {
        char *err_ret = dupstr(err);
        sk_close(pf->s);
        free_portfwd_state(pf);
        *chan_ret = NULL;
        return err_ret;
    }

    return NULL;
}